

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O1

int read_item(char **pp,char *end,string *buf,bool left)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  ulong uVar6;
  
  iVar2 = skip_blank(pp,end);
  if (iVar2 == 0x100) {
    buf->_M_string_length = 0;
    *(buf->_M_dataplus)._M_p = '\0';
    return 0x100;
  }
  pbVar1 = (byte *)*pp;
  if (pbVar1 == (byte *)end) {
    pbVar5 = (byte *)0x0;
  }
  else {
    bVar4 = 0x23;
    if (left) {
      bVar4 = 0x3d;
    }
    pbVar5 = (byte *)0x0;
    pbVar3 = pbVar1;
    do {
      uVar6 = (ulong)*pbVar3;
      if (uVar6 < 0x3c) {
        if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
          if ((0x800000000002400U >> (uVar6 & 0x3f) & 1) == 0) goto LAB_001646ed;
          goto LAB_0016470e;
        }
        if (pbVar5 == (byte *)0x0) {
          pbVar5 = pbVar3;
        }
      }
      else {
LAB_001646ed:
        if (*pbVar3 == bVar4) {
LAB_0016470e:
          if (pbVar5 == (byte *)0x0) {
            pbVar5 = pbVar3;
          }
          goto LAB_00164715;
        }
        pbVar5 = (byte *)0x0;
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (byte *)end);
  }
  pbVar3 = (byte *)end;
  if (pbVar5 == (byte *)0x0) {
    pbVar5 = (byte *)end;
  }
LAB_00164715:
  *pp = (char *)pbVar3;
  if (pbVar5 == (byte *)0x0) {
    __assert_fail("value_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                  ,0x101,"int read_item(const char **, const char *, std::string &, bool)");
  }
  std::__cxx11::string::replace((ulong)buf,0,(char *)buf->_M_string_length,(ulong)pbVar1);
  iVar2 = skip_blank(pp,end);
  return iVar2;
}

Assistant:

static int read_item(const char** pp, const char* end, std::string& buf, bool left)
{
	int c = skip_blank(pp, end);
	if (c == IF_EOL) {
		buf.clear();
		return c;
	}
	const char* value = *pp;
	const char* value_end = 0;
	for (const char* p = value;; ++p) {
		if (p == end) {
			if (value_end == 0)
				value_end = end;
			*pp = end;
			break;
		}
		c = *p;
		if (c == ' ' || c =='\t') {
			if (value_end == 0)
				value_end = p;
		} else if (c == '\n' || c == '\r' || c == ';' || (!left && c == '#') || (left && c == '=')) {
			if (value_end == 0)
				value_end = p;
			*pp = p;
			break;
		} else {
			value_end = 0;
		}
	}
	xr_assert(value_end);
	buf.assign(value, value_end);
	return skip_blank(pp, end);
}